

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fMultisampleTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_0::MaskInvertCase::drawPattern
          (MaskInvertCase *this,bool invert)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  deUint32 err;
  undefined4 extraout_var;
  int iVar5;
  uint uVar6;
  undefined7 in_register_00000031;
  int iVar7;
  Vec4 *c0;
  Vec4 *c1;
  int iVar8;
  ulong uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  Vec2 local_48;
  float fStack_40;
  float fStack_3c;
  Vec4 *pVVar4;
  
  iVar1 = (*((this->super_DefaultFBOMultisampleCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  pVVar4 = (Vec4 *)CONCAT44(extraout_var,iVar1);
  iVar1 = 0;
  do {
    fVar12 = (float)iVar1;
    fVar10 = fVar12 + 0.5;
    fVar11 = fVar12 / 25.0;
    local_48.m_data[0] = fVar11 * 0.6 + 0.4;
    local_48.m_data[1] = fVar11 * 0.3 + 0.5;
    fStack_40 = -fVar11 * 0.5 + 0.6;
    fStack_3c = -fVar11 * 0.7 + 0.7;
    iVar5 = (this->super_DefaultFBOMultisampleCase).m_numSamples;
    uVar6 = iVar5 - 1;
    uVar2 = iVar5 + 0x1e;
    if (-1 < (int)uVar6) {
      uVar2 = uVar6;
    }
    iVar5 = iVar5 - (uVar2 & 0xffffffe0);
    if (-0x20 < (int)uVar6) {
      uVar9 = 0;
      iVar7 = 0;
      do {
        uVar6 = ((uint)(uVar9 >> 0x10) ^ iVar1 + (int)uVar9 ^ 0x3d) * 9;
        uVar3 = (uVar6 >> 4 ^ uVar6) * 0x27d4eb2d;
        iVar8 = iVar7 + 1;
        uVar6 = 0xffffffff;
        if ((int)uVar2 >> 5 == iVar7) {
          uVar6 = ~(-1 << ((byte)iVar5 & 0x1f));
        }
        if (0x1f < iVar5) {
          uVar6 = 0xffffffff;
        }
        (**(code **)(pVVar4[0x125].m_data + 2))
                  (iVar7,uVar6 & (uVar3 >> 0xf ^ -(int)CONCAT71(in_register_00000031,invert) ^ uVar3
                                 ));
        uVar9 = (ulong)((int)uVar9 + 0x20);
        iVar7 = iVar8;
      } while (((int)uVar2 >> 5) + 1 != iVar8);
    }
    c1 = (Vec4 *)0xffffffff;
    fVar11 = (fVar12 * 6.2831855) / 25.0;
    fVar10 = (fVar10 * 6.2831855) / 25.0;
    c0 = pVVar4;
    err = (**(code **)pVVar4[0x80].m_data)();
    glu::checkError(err,"glSampleMaski",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleTests.cpp"
                    ,0x20b);
    cosf(fVar11);
    sinf(fVar11);
    cosf(fVar10);
    sinf(fVar10);
    DefaultFBOMultisampleCase::renderTriangle
              (&this->super_DefaultFBOMultisampleCase,&local_48,&local_48,&local_48,c0,c1,
               (Vec4 *)CONCAT44(fVar10,fVar11));
    iVar1 = iVar1 + 1;
  } while (iVar1 != 0x19);
  return;
}

Assistant:

void MaskInvertCase::drawPattern (bool invert) const
{
	const int				numTriangles	= 25;
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();

	for (int triNdx = 0; triNdx < numTriangles; triNdx++)
	{
		const float	angle0	= 2.0f*DE_PI * (float)triNdx			/ (float)numTriangles;
		const float	angle1	= 2.0f*DE_PI * ((float)triNdx + 0.5f)	/ (float)numTriangles;
		const Vec4	color	= Vec4(0.4f + (float)triNdx/(float)numTriangles*0.6f,
		                           0.5f + (float)triNdx/(float)numTriangles*0.3f,
		                           0.6f - (float)triNdx/(float)numTriangles*0.5f,
		                           0.7f - (float)triNdx/(float)numTriangles*0.7f);


		const int			wordCount		= getEffectiveSampleMaskWordCount(m_numSamples - 1);
		const GLbitfield	finalWordBits	= m_numSamples - 32 * ((m_numSamples-1) / 32);
		const GLbitfield	finalWordMask	= (GLbitfield)deBitMask32(0, (int)finalWordBits);

		for (int wordNdx = 0; wordNdx < wordCount; ++wordNdx)
		{
			const GLbitfield	rawMask		= (GLbitfield)deUint32Hash(wordNdx * 32 + triNdx);
			const GLbitfield	mask		= (invert) ? (~rawMask) : (rawMask);
			const bool			isFinalWord	= (wordNdx + 1) == wordCount;
			const GLbitfield	maskMask	= (isFinalWord) ? (finalWordMask) : (0xFFFFFFFFUL); // maskMask prevents setting coverage bits higher than sample count

			gl.sampleMaski(wordNdx, mask & maskMask);
		}
		GLU_EXPECT_NO_ERROR(gl.getError(), "glSampleMaski");

		renderTriangle(Vec2(0.0f, 0.0f),
					   Vec2(deFloatCos(angle0)*0.95f, deFloatSin(angle0)*0.95f),
					   Vec2(deFloatCos(angle1)*0.95f, deFloatSin(angle1)*0.95f),
					   color);
	}
}